

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::DatePartFunction<duckdb::interval_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined1 *puVar1;
  ValidityMask *this;
  ulong *puVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  long *plVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var10;
  sel_t *psVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  byte bVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  data_ptr_t pdVar17;
  reference vector;
  reference vector_00;
  long lVar18;
  TemplatedValidityData<unsigned_long> *pTVar19;
  SelectionVector *pSVar20;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  long lVar22;
  SelectionVector *pSVar23;
  ulong uVar24;
  SelectionVector *pSVar25;
  ulong uVar26;
  SelectionVector *count;
  idx_t idx_in_entry;
  ValidityMask *other;
  data_ptr_t pdVar27;
  unsigned_long uVar28;
  UnifiedVectorFormat ldata;
  data_ptr_t local_118;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar3 = vector->vector_type;
  VVar4 = vector_00->vector_type;
  if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar6 = (long *)result->data;
    if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
       ((puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar5 == (unsigned_long *)0x0 || ((*puVar5 & 1) != 0)))) {
      lVar18 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                         (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                          *(undefined8 *)vector_00->data,*(undefined8 *)(vector_00->data + 8));
      *plVar6 = lVar18;
      return;
    }
  }
  else {
    count = (SelectionVector *)args->count;
    if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      local_118 = vector->data;
      pdVar7 = vector_00->data;
      puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar8 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          _Var21._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar27 = local_c8.data;
          pSVar25 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar25;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var21._M_head_impl =
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             _Var21._M_head_impl;
        if (_Var21._M_head_impl != (unsigned_long *)0x0) {
          puVar1 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if (puVar1 < (undefined1 *)0x40) {
            return;
          }
          uVar24 = 0;
          pSVar25 = (SelectionVector *)0x0;
          do {
            puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              uVar28 = 0xffffffffffffffff;
            }
            else {
              uVar28 = puVar5[uVar24];
            }
            pSVar20 = (SelectionVector *)
                      &pSVar25[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (count <= pSVar20) {
              pSVar20 = count;
            }
            pSVar23 = pSVar20;
            if (uVar28 != 0) {
              pSVar23 = pSVar25;
              if (uVar28 == 0xffffffffffffffff) {
                if (pSVar25 < pSVar20) {
                  uVar12 = *(undefined8 *)pdVar7;
                  uVar13 = *(undefined8 *)(pdVar7 + 8);
                  pdVar27 = local_118 + (long)pSVar25 * 0x10 + 8;
                  do {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                       (*(undefined8 *)(pdVar27 + -8),*(undefined8 *)pdVar27,uVar12,
                                        uVar13);
                    *(long *)(pdVar8 + (long)pSVar23 * 8) = lVar18;
                    pSVar23 = (SelectionVector *)((long)&pSVar23->sel_vector + 1);
                    pdVar27 = pdVar27 + 0x10;
                  } while (pSVar20 != pSVar23);
                }
              }
              else if (pSVar25 < pSVar20) {
                pdVar27 = local_118 + (long)pSVar25 * 0x10 + 8;
                uVar26 = 0;
                do {
                  if ((uVar28 >> (uVar26 & 0x3f) & 1) != 0) {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                       (*(undefined8 *)(pdVar27 + -8),*(undefined8 *)pdVar27,
                                        *(undefined8 *)pdVar7,*(undefined8 *)(pdVar7 + 8));
                    *(long *)(pdVar8 + uVar26 * 8 + (long)pSVar25 * 8) = lVar18;
                  }
                  uVar26 = uVar26 + 1;
                  pdVar27 = pdVar27 + 0x10;
                } while ((long)pSVar25 + (uVar26 - (long)pSVar20) != 0);
                pSVar23 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar26);
              }
            }
            uVar24 = uVar24 + 1;
            pSVar25 = pSVar23;
          } while (uVar24 != (ulong)puVar1 >> 6);
          return;
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar12 = *(undefined8 *)pdVar7;
        uVar13 = *(undefined8 *)(pdVar7 + 8);
        local_118 = local_118 + 8;
        pSVar25 = (SelectionVector *)0x0;
        do {
          lVar18 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                             (*(undefined8 *)(local_118 + -8),*(undefined8 *)local_118,uVar12,uVar13
                             );
          *(long *)(pdVar8 + (long)pSVar25 * 8) = lVar18;
          pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
          local_118 = local_118 + 0x10;
        } while (count != pSVar25);
        return;
      }
    }
    else {
      if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
        if (VVar4 == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
          pdVar7 = vector->data;
          pdVar8 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar27 = result->data;
          FlatVector::VerifyFlatVector(result);
          this = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
          if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_78.sel = count;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            _Var21._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_78.sel = count;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                       (unsigned_long *)&local_78);
            pdVar17 = local_c8.data;
            pSVar25 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar25;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar17;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var21._M_head_impl =
                 (pTVar19->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl;
          FlatVector::VerifyFlatVector(vector_00);
          other = &vector_00->validity;
          if (_Var21._M_head_impl == (unsigned_long *)0x0) {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
            if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_78.sel = count;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              _Var21._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_78.sel = count;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long **)other,(unsigned_long *)&local_78);
              pdVar17 = local_c8.data;
              pSVar25 = local_c8.sel;
              local_c8.sel = (SelectionVector *)0x0;
              local_c8.data = (data_ptr_t)0x0;
              p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar25;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar17;
              if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
              }
              pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var21._M_head_impl =
                   (pTVar19->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl;
          }
          else {
            ValidityMask::Combine(this,other,(idx_t)count);
          }
          if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              lVar18 = 0;
              do {
                lVar22 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                   (*(undefined8 *)(pdVar7 + lVar18 * 2),
                                    *(undefined8 *)(pdVar7 + lVar18 * 2 + 8),
                                    *(undefined8 *)(pdVar8 + lVar18 * 2),
                                    *(undefined8 *)(pdVar8 + lVar18 * 2 + 8));
                *(long *)(pdVar27 + lVar18) = lVar22;
                lVar18 = lVar18 + 8;
                count = (SelectionVector *)
                        ((long)&count[-1].selection_data.internal.
                                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 7);
              } while (count != (SelectionVector *)0x0);
            }
          }
          else {
            puVar1 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if ((undefined1 *)0x3f < puVar1) {
              uVar24 = 0;
              pSVar25 = (SelectionVector *)0x0;
              do {
                puVar5 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  uVar28 = 0xffffffffffffffff;
                }
                else {
                  uVar28 = puVar5[uVar24];
                }
                pSVar20 = (SelectionVector *)
                          &pSVar25[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar20) {
                  pSVar20 = count;
                }
                pSVar23 = pSVar20;
                if (uVar28 != 0) {
                  pSVar23 = pSVar25;
                  if (uVar28 == 0xffffffffffffffff) {
                    if (pSVar25 < pSVar20) {
                      lVar18 = (long)pSVar25 * 2 + 1;
                      do {
                        lVar22 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                           (*(undefined8 *)(pdVar7 + lVar18 * 8 + -8),
                                            *(undefined8 *)(pdVar7 + lVar18 * 8),
                                            *(undefined8 *)(pdVar8 + lVar18 * 8 + -8),
                                            *(undefined8 *)(pdVar8 + lVar18 * 8));
                        *(long *)(pdVar27 + (long)pSVar23 * 8) = lVar22;
                        pSVar23 = (SelectionVector *)((long)&pSVar23->sel_vector + 1);
                        lVar18 = lVar18 + 2;
                      } while (pSVar20 != pSVar23);
                    }
                  }
                  else if (pSVar25 < pSVar20) {
                    lVar18 = (long)pSVar25 * 2 + 1;
                    uVar26 = 0;
                    do {
                      if ((uVar28 >> (uVar26 & 0x3f) & 1) != 0) {
                        lVar22 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                           (*(undefined8 *)(pdVar7 + lVar18 * 8 + -8),
                                            *(undefined8 *)(pdVar7 + lVar18 * 8),
                                            *(undefined8 *)(pdVar8 + lVar18 * 8 + -8),
                                            *(undefined8 *)(pdVar8 + lVar18 * 8));
                        *(long *)(pdVar27 + uVar26 * 8 + (long)pSVar25 * 8) = lVar22;
                      }
                      uVar26 = uVar26 + 1;
                      lVar18 = lVar18 + 2;
                    } while ((long)pSVar25 + (uVar26 - (long)pSVar20) != 0);
                    pSVar23 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar26);
                  }
                }
                uVar24 = uVar24 + 1;
                pSVar25 = pSVar23;
              } while (uVar24 != (ulong)puVar1 >> 6);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,(idx_t)count,&local_c8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar7 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              _Var10._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar11 = (local_78.sel)->sel_vector;
              pSVar25 = (SelectionVector *)0x0;
              do {
                pSVar20 = pSVar25;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var10._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar20 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var10._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar25 * 4);
                }
                pSVar23 = pSVar25;
                if (psVar11 != (sel_t *)0x0) {
                  pSVar23 = (SelectionVector *)(ulong)psVar11[(long)pSVar25];
                }
                uVar13._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar20 * 0x10))->_M_use_count;
                uVar13._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar20 * 0x10))->_M_weak_count;
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar20 * 0x10))->_vptr__Sp_counted_base,
                                    uVar13,*(undefined8 *)(local_78.data + (long)pSVar23 * 0x10),
                                    *(undefined8 *)(local_78.data + (long)pSVar23 * 0x10 + 8));
                *(long *)(pdVar7 + (long)pSVar25 * 8) = lVar18;
                pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
              } while (count != pSVar25);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            _Var10._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar11 = (local_78.sel)->sel_vector;
            pSVar25 = (SelectionVector *)0x0;
            do {
              pSVar20 = pSVar25;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var10._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar20 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var10._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar25 * 4);
              }
              pSVar23 = pSVar25;
              if (psVar11 != (sel_t *)0x0) {
                pSVar23 = (SelectionVector *)(ulong)psVar11[(long)pSVar25];
              }
              if (((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar20 >> 6] >> ((ulong)pSVar20 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar23 >> 6] >> ((ulong)pSVar23 & 0x3f) & 1) != 0)))) {
                uVar12._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar20 * 0x10))->_M_use_count;
                uVar12._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar20 * 0x10))->_M_weak_count;
                lVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar20 * 0x10))->_vptr__Sp_counted_base,
                                    uVar12,*(undefined8 *)(local_78.data + (long)pSVar23 * 0x10),
                                    *(undefined8 *)(local_78.data + (long)pSVar23 * 0x10 + 8));
                *(long *)(pdVar7 + (long)pSVar25 * 8) = lVar18;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var16 = p_Stack_e0;
                  peVar15 = local_e8;
                  local_e8 = (element_type *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar15;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var16;
                  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
                  }
                  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar19->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar14 = (byte)pSVar25 & 0x3f;
                puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + ((ulong)pSVar25 >> 6);
                *puVar2 = *puVar2 & (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
              }
              pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
            } while (count != pSVar25);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar7 = vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      local_118 = vector_00->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar8 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          _Var21._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar27 = local_c8.data;
          pSVar25 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var9 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar25;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar27;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var21._M_head_impl =
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             _Var21._M_head_impl;
        if (_Var21._M_head_impl != (unsigned_long *)0x0) {
          puVar1 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if (puVar1 < (undefined1 *)0x40) {
            return;
          }
          uVar24 = 0;
          pSVar25 = (SelectionVector *)0x0;
          do {
            puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              uVar28 = 0xffffffffffffffff;
            }
            else {
              uVar28 = puVar5[uVar24];
            }
            pSVar20 = (SelectionVector *)
                      &pSVar25[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (count <= pSVar20) {
              pSVar20 = count;
            }
            pSVar23 = pSVar20;
            if (uVar28 != 0) {
              pSVar23 = pSVar25;
              if (uVar28 == 0xffffffffffffffff) {
                if (pSVar25 < pSVar20) {
                  uVar12 = *(undefined8 *)pdVar7;
                  uVar13 = *(undefined8 *)(pdVar7 + 8);
                  pdVar27 = local_118 + (long)pSVar25 * 0x10 + 8;
                  do {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                       (uVar12,uVar13,*(undefined8 *)(pdVar27 + -8),
                                        *(undefined8 *)pdVar27);
                    *(long *)(pdVar8 + (long)pSVar23 * 8) = lVar18;
                    pSVar23 = (SelectionVector *)((long)&pSVar23->sel_vector + 1);
                    pdVar27 = pdVar27 + 0x10;
                  } while (pSVar20 != pSVar23);
                }
              }
              else if (pSVar25 < pSVar20) {
                pdVar27 = local_118 + (long)pSVar25 * 0x10 + 8;
                uVar26 = 0;
                do {
                  if ((uVar28 >> (uVar26 & 0x3f) & 1) != 0) {
                    lVar18 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                       (*(undefined8 *)pdVar7,*(undefined8 *)(pdVar7 + 8),
                                        *(undefined8 *)(pdVar27 + -8),*(undefined8 *)pdVar27);
                    *(long *)(pdVar8 + uVar26 * 8 + (long)pSVar25 * 8) = lVar18;
                  }
                  uVar26 = uVar26 + 1;
                  pdVar27 = pdVar27 + 0x10;
                } while ((long)pSVar25 + (uVar26 - (long)pSVar20) != 0);
                pSVar23 = (SelectionVector *)((long)&pSVar25->sel_vector + uVar26);
              }
            }
            uVar24 = uVar24 + 1;
            pSVar25 = pSVar23;
          } while (uVar24 != (ulong)puVar1 >> 6);
          return;
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar12 = *(undefined8 *)pdVar7;
        uVar13 = *(undefined8 *)(pdVar7 + 8);
        local_118 = local_118 + 8;
        pSVar25 = (SelectionVector *)0x0;
        do {
          lVar18 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                             (uVar12,uVar13,*(undefined8 *)(local_118 + -8),*(undefined8 *)local_118
                             );
          *(long *)(pdVar8 + (long)pSVar25 * 8) = lVar18;
          pSVar25 = (SelectionVector *)((long)&pSVar25->sel_vector + 1);
          local_118 = local_118 + 0x10;
        } while (count != pSVar25);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}